

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::PriceUpdateDecoderTest_test_decode_size_quantity_Test::TestBody
          (PriceUpdateDecoderTest_test_decode_size_quantity_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  PriceField price_field;
  uint64_t size;
  FieldDef field_def;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  AssertHelper local_98;
  internal local_90 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  ByteBuffer local_80 [16];
  unsigned_long local_70;
  long *local_68 [2];
  long local_58 [2];
  FieldDef local_48 [8];
  long *local_40;
  long local_30 [3];
  
  local_70 = 0xd95d302789527;
  bidfx_public_api::tools::Varint::WriteU64
            ((OutputStream *)&(this->super_PriceUpdateDecoderTest).field_0x18,0xd95d302789527);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"field","");
  bidfx_public_api::price::pixie::FieldDef::FieldDef(local_48,1,0x4c,(string *)local_68,0x56,0);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  bidfx_public_api::price::pixie::PriceUpdateDecoder::DecodeField
            (local_80,(FieldDef *)&(this->super_PriceUpdateDecoderTest).buffer);
  local_a0.ptr_._0_4_ = 1;
  local_98.data_._0_4_ = bidfx_public_api::price::PriceField::GetType();
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::PriceField::Type,bidfx_public_api::price::PriceField::Type>
            (local_90,"PriceField::LONG","price_field.GetType()",(Type *)&local_a0,(Type *)&local_98
            );
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (local_88.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_88.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x70,pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_a0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_a0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_a0.ptr_ + 8))();
      }
      local_a0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_a0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       bidfx_public_api::price::PriceField::GetLong();
  testing::internal::CmpHelperEQ<unsigned_long,long>
            (local_90,"size","price_field.GetLong()",&local_70,(long *)&local_a0);
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (local_88.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_88.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x71,pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_a0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_a0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_a0.ptr_ + 8))();
      }
      local_a0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)local_80);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return;
}

Assistant:

TEST_F(PriceUpdateDecoderTest, test_decode_size_quantity)
{
    uint64_t size = 3823908209333543L;
    Varint::WriteU64(buffer, size);
    FieldDef field_def = FieldDef(1, FieldTypeEnum::LONG, "field", FieldEncodingEnum::VARINT, 0);
    PriceField price_field = PriceUpdateDecoder::DecodeField(buffer, field_def);
    EXPECT_EQ(PriceField::LONG, price_field.GetType());
    EXPECT_EQ(size, price_field.GetLong());
}